

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<FunctionDef>::moveAppend
          (QGenericArrayOps<FunctionDef> *this,FunctionDef *b,FunctionDef *e)

{
  qsizetype *pqVar1;
  FunctionDef *pFVar2;
  long lVar3;
  Data *pDVar4;
  char *pcVar5;
  qsizetype qVar6;
  Data *pDVar7;
  ArgumentDef *pAVar8;
  undefined8 uVar9;
  FunctionDef *pFVar10;
  TypeTags TVar11;
  int iVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  
  if ((b != e) && (b < e)) {
    pFVar2 = (this->super_QArrayDataPointer<FunctionDef>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<FunctionDef>).size;
      pDVar4 = (b->type).name.d.d;
      (b->type).name.d.d = (Data *)0x0;
      pFVar2[lVar3].type.name.d.d = pDVar4;
      pcVar5 = (b->type).name.d.ptr;
      (b->type).name.d.ptr = (char *)0x0;
      pFVar2[lVar3].type.name.d.ptr = pcVar5;
      qVar6 = (b->type).name.d.size;
      (b->type).name.d.size = 0;
      pFVar2[lVar3].type.name.d.size = qVar6;
      pDVar4 = (b->type).rawName.d.d;
      (b->type).rawName.d.d = (Data *)0x0;
      pFVar2[lVar3].type.rawName.d.d = pDVar4;
      pcVar5 = (b->type).rawName.d.ptr;
      (b->type).rawName.d.ptr = (char *)0x0;
      pFVar2[lVar3].type.rawName.d.ptr = pcVar5;
      qVar6 = (b->type).rawName.d.size;
      (b->type).rawName.d.size = 0;
      pFVar2[lVar3].type.rawName.d.size = qVar6;
      TVar11.super_QFlagsStorageHelper<TypeTag,_4>.super_QFlagsStorage<TypeTag>.i =
           (b->type).typeTag.super_QFlagsStorageHelper<TypeTag,_4>;
      uVar9 = *(undefined8 *)&(b->type).firstToken;
      pFVar10 = pFVar2 + lVar3;
      *(undefined4 *)&(pFVar10->type).field_0x30 = *(undefined4 *)&(b->type).field_0x30;
      (pFVar10->type).typeTag =
           (TypeTags)TVar11.super_QFlagsStorageHelper<TypeTag,_4>.super_QFlagsStorage<TypeTag>.i;
      *(undefined8 *)(&(pFVar10->type).field_0x30 + 8) = uVar9;
      pDVar7 = (b->arguments).d.d;
      (b->arguments).d.d = (Data *)0x0;
      pFVar2[lVar3].arguments.d.d = pDVar7;
      pAVar8 = (b->arguments).d.ptr;
      (b->arguments).d.ptr = (ArgumentDef *)0x0;
      pFVar2[lVar3].arguments.d.ptr = pAVar8;
      qVar6 = (b->arguments).d.size;
      (b->arguments).d.size = 0;
      pFVar2[lVar3].arguments.d.size = qVar6;
      pDVar4 = (b->normalizedType).d.d;
      (b->normalizedType).d.d = (Data *)0x0;
      pFVar2[lVar3].normalizedType.d.d = pDVar4;
      pcVar5 = (b->normalizedType).d.ptr;
      (b->normalizedType).d.ptr = (char *)0x0;
      pFVar2[lVar3].normalizedType.d.ptr = pcVar5;
      qVar6 = (b->normalizedType).d.size;
      (b->normalizedType).d.size = 0;
      pFVar2[lVar3].normalizedType.d.size = qVar6;
      pDVar4 = (b->tag).d.d;
      (b->tag).d.d = (Data *)0x0;
      pFVar2[lVar3].tag.d.d = pDVar4;
      pcVar5 = (b->tag).d.ptr;
      (b->tag).d.ptr = (char *)0x0;
      pFVar2[lVar3].tag.d.ptr = pcVar5;
      qVar6 = (b->tag).d.size;
      (b->tag).d.size = 0;
      pFVar2[lVar3].tag.d.size = qVar6;
      pDVar4 = (b->name).d.d;
      (b->name).d.d = (Data *)0x0;
      pFVar2[lVar3].name.d.d = pDVar4;
      pcVar5 = (b->name).d.ptr;
      (b->name).d.ptr = (char *)0x0;
      pFVar2[lVar3].name.d.ptr = pcVar5;
      qVar6 = (b->name).d.size;
      (b->name).d.size = 0;
      pFVar2[lVar3].name.d.size = qVar6;
      pDVar4 = (b->inPrivateClass).d.d;
      (b->inPrivateClass).d.d = (Data *)0x0;
      pFVar2[lVar3].inPrivateClass.d.d = pDVar4;
      pcVar5 = (b->inPrivateClass).d.ptr;
      (b->inPrivateClass).d.ptr = (char *)0x0;
      pFVar2[lVar3].inPrivateClass.d.ptr = pcVar5;
      qVar6 = (b->inPrivateClass).d.size;
      (b->inPrivateClass).d.size = 0;
      pFVar2[lVar3].inPrivateClass.d.size = qVar6;
      iVar12 = b->revision;
      uVar9 = *(undefined8 *)&b->isConst;
      pFVar10 = pFVar2 + lVar3;
      pFVar10->access = b->access;
      pFVar10->revision = iVar12;
      *(undefined8 *)(&pFVar10->access + 2) = uVar9;
      bVar13 = b->isSlot;
      bVar14 = b->isSignal;
      bVar15 = b->isPrivateSignal;
      bVar16 = b->isConstructor;
      bVar17 = b->isDestructor;
      bVar18 = b->isAbstract;
      bVar19 = b->isRawSlot;
      pFVar10 = pFVar2 + lVar3;
      pFVar10->isScriptable = b->isScriptable;
      pFVar10->isSlot = bVar13;
      pFVar10->isSignal = bVar14;
      pFVar10->isPrivateSignal = bVar15;
      pFVar10->isConstructor = bVar16;
      pFVar10->isDestructor = bVar17;
      pFVar10->isAbstract = bVar18;
      pFVar10->isRawSlot = bVar19;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<FunctionDef>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }